

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall cs::extension::extension(extension *this,string *path)

{
  undefined4 uVar1;
  string *psVar2;
  code *pcVar3;
  undefined8 uVar4;
  runtime_error *this_00;
  __off_t __length;
  __off_t __length_00;
  undefined8 *in_RDI;
  dll_main_entrance_t dll_main;
  dll_compatible_check_t dll_check;
  dll *dll;
  string *in_stack_fffffffffffffe18;
  runtime_error *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  allocator *paVar5;
  string *in_stack_fffffffffffffe38;
  name_space *in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe54;
  int in_stack_fffffffffffffe58;
  uint in_stack_fffffffffffffe5c;
  int __val;
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [32];
  code *local_128;
  undefined1 local_119;
  allocator local_51;
  string local_50 [32];
  code *local_30;
  string *local_18;
  
  name_space::name_space(in_stack_fffffffffffffe40);
  *in_RDI = &PTR__extension_003dedb0;
  psVar2 = (string *)operator_new(8);
  cov::dll::dll((dll *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  local_18 = psVar2;
  garbage_collector<cov::dll>::add
            ((garbage_collector<cov::dll> *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  psVar2 = local_18;
  std::allocator<char>::allocator();
  __val = (int)((ulong)psVar2 >> 0x20);
  std::__cxx11::string::string(local_50,"__CS_ABI_COMPATIBLE__",&local_51);
  pcVar3 = (code *)cov::dll::get_address((dll *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38)
  ;
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_30 = pcVar3;
  if (pcVar3 != (code *)0x0) {
    in_stack_fffffffffffffe5c = (*pcVar3)();
    in_stack_fffffffffffffe58 =
         truncate((extension *)(ulong)in_stack_fffffffffffffe5c,(char *)0x4,__length);
    in_stack_fffffffffffffe54 = truncate((extension *)0x383a4,(char *)0x4,__length_00);
    if (in_stack_fffffffffffffe58 == in_stack_fffffffffffffe54) {
      paVar5 = &local_149;
      psVar2 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"__CS_EXTENSION_MAIN__",paVar5);
      pcVar3 = (code *)cov::dll::get_address((dll *)paVar5,psVar2);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      local_128 = pcVar3;
      if (pcVar3 != (code *)0x0) {
        (*pcVar3)(in_RDI,current_process);
        return;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
      paVar5 = &local_171;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,"Broken Covariant Script Extension.",paVar5);
      runtime_error::runtime_error(this_00,in_stack_fffffffffffffe18);
      __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  local_119 = 1;
  uVar4 = __cxa_allocate_exception(0x28);
  uVar1 = (*local_30)();
  std::__cxx11::to_string(__val);
  std::operator+((char *)in_stack_fffffffffffffe28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe20);
  std::operator+(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
  std::__cxx11::to_string(__val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe54,uVar1));
  std::operator+(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
  runtime_error::runtime_error(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  local_119 = 0;
  __cxa_throw(uVar4,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

explicit extension(const std::string &path)
		{
			using namespace dll_resources;
			cov::dll *dll = new cov::dll(path);
			gc.add(dll);
			dll_compatible_check_t dll_check = reinterpret_cast<dll_compatible_check_t>(dll->get_address(
			                                       dll_compatible_check));
			if (dll_check == nullptr || truncate(dll_check(), 4) != truncate(COVSCRIPT_ABI_VERSION, 4))
				throw runtime_error("Incompatible Covariant Script Extension.(Target: " + std::to_string(dll_check()) +
				                    ", Current: " + std::to_string(COVSCRIPT_ABI_VERSION) + ")");
			dll_main_entrance_t dll_main = reinterpret_cast<dll_main_entrance_t>(dll->get_address(dll_main_entrance));
			if (dll_main != nullptr) {
				dll_main(this, current_process);
			}
			else
				throw runtime_error("Broken Covariant Script Extension.");
		}